

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool VectorAngle(ON_2dVector *v,double *angle)

{
  bool bVar1;
  double dVar2;
  
  bVar1 = ON_2dVector::IsTiny(v,2.3283064365386963e-10);
  if (!bVar1) {
    dVar2 = atan2(v->y,v->x);
    dVar2 = (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar2 |
                    (ulong)(dVar2 + 6.283185307179586) & -(ulong)(dVar2 < 0.0));
    *angle = (double)(~-(ulong)(6.283185307179586 < dVar2) & (ulong)dVar2 |
                     (ulong)(dVar2 + -6.283185307179586) & -(ulong)(6.283185307179586 < dVar2));
  }
  return !bVar1;
}

Assistant:

static bool VectorAngle( const ON_2dVector& v, double& angle)
{
  if( v.IsTiny())
    return false;

  angle = atan2( v.y, v.x);

  if( angle < 0.0)
    angle += 2.0 * ON_PI;

  if( angle > 2.0 * ON_PI)
    angle -= 2.0 * ON_PI;

  return true;
}